

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_RH_ENDORSEMENT_Unmarshal
                 (TPMI_RH_ENDORSEMENT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_RH_ENDORSEMENT *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if (*target == 0x40000007) {
      if (flag == 0) {
        return 0x84;
      }
    }
    else if (*target != 0x4000000b) {
      return 0x84;
    }
    target_local._4_4_ = 0;
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_RH_ENDORSEMENT_Unmarshal(TPMI_RH_ENDORSEMENT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_ENDORSEMENT:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}